

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

bool __thiscall
test_case::eval(test_case *this,ggml_backend_t backend1,ggml_backend_t backend2,char *op_name)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  reference ppgVar8;
  _func_bool_int_ggml_tensor_ptr_ggml_tensor_ptr_void_ptr *p_Var9;
  long in_RCX;
  undefined8 in_RDX;
  ggml_backend *in_RSI;
  long *in_RDI;
  bool cmp_ok;
  anon_class_1_0_00000001 callback;
  callback_userdata ud;
  ggml_tensor *sentinel;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range1_1;
  ggml_backend_buffer_t buf;
  ggml_tensor *t;
  ggml_backend_t backend;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<ggml_backend_*> *__range1;
  bool supported;
  ggml_tensor *out;
  ggml_context *ctx;
  ggml_init_params params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ggml_context *ctx_00;
  test_case *in_stack_fffffffffffffe30;
  bool local_191;
  _lambda_int_ggml_tensor__ggml_tensor__void___1_ local_179;
  byte local_178 [8];
  undefined8 local_170;
  ggml_backend *local_168;
  undefined8 local_160;
  ggml_tensor *local_158;
  ggml_tensor **local_150;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_148;
  long *local_140;
  long local_138;
  long local_130;
  ggml_backend *local_128;
  const_iterator local_120;
  const_iterator local_118;
  ggml_backend *local_110;
  undefined8 local_108;
  initializer_list<ggml_backend_*> local_100;
  initializer_list<ggml_backend_*> *local_f0;
  byte local_e1;
  string local_e0 [32];
  string local_c0 [55];
  byte local_89;
  string local_88 [32];
  undefined8 local_68;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_60;
  undefined8 local_58;
  ggml_context *local_50;
  long local_48;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  long local_28;
  undefined8 local_20;
  ggml_backend *local_18;
  bool local_1;
  
  *(undefined4 *)(in_RDI + 3) = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar3 = ggml_tensor_overhead();
  lVar4 = ggml_graph_overhead();
  this_00 = (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar3 * 0x80 + lVar4);
  local_38 = 0;
  local_30 = 1;
  local_58 = 0;
  ctx_00 = (ggml_context *)CONCAT71(uStack_2f,1);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60 = this_00;
  local_50 = ctx_00;
  local_40 = this_00;
  local_48 = ggml_init();
  if (local_48 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-backend-ops.cpp"
               ,0x1bc,"GGML_ASSERT(%s) failed","ctx");
  }
  lVar3 = ggml_new_graph(local_48);
  in_RDI[1] = lVar3;
  add_sentinel(in_stack_fffffffffffffe30,ctx_00);
  local_68 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_48);
  local_89 = 0;
  local_191 = false;
  if (local_28 != 0) {
    (**(code **)(*in_RDI + 0x10))(local_88,in_RDI,local_68);
    local_89 = 1;
    local_191 = std::operator!=(__lhs,(char *)this_00);
  }
  if ((local_89 & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  if (local_191 == false) {
    (**(code **)(*in_RDI + 0x10))(local_c0,in_RDI,local_68);
    uVar5 = std::__cxx11::string::c_str();
    (**(code **)(*in_RDI + 0x18))(local_e0);
    uVar6 = std::__cxx11::string::c_str();
    printf("  %s(%s): ",uVar5,uVar6);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
    fflush(_stdout);
    local_e1 = 1;
    local_110 = local_18;
    local_108 = local_20;
    local_100._M_array = &local_110;
    local_100._M_len = 2;
    local_f0 = &local_100;
    local_118 = std::initializer_list<ggml_backend_*>::begin(local_f0);
    local_120 = std::initializer_list<ggml_backend_*>::end
                          ((initializer_list<ggml_backend_*> *)__lhs);
    for (; local_118 != local_120; local_118 = local_118 + 1) {
      local_128 = *local_118;
      for (local_130 = ggml_get_first_tensor(local_48); local_130 != 0;
          local_130 = ggml_get_next_tensor(local_48,local_130)) {
        uVar7 = ggml_backend_supports_op(local_128,local_130);
        if ((uVar7 & 1) == 0) {
          uVar5 = ggml_backend_name(local_128);
          printf("not supported [%s] ",uVar5);
          local_e1 = 0;
          break;
        }
      }
    }
    if ((local_e1 & 1) == 0) {
      printf("\n");
      ggml_free(local_48);
      local_1 = true;
    }
    else {
      add_sentinel(in_stack_fffffffffffffe30,ctx_00);
      local_138 = ggml_backend_alloc_ctx_tensors(local_48,local_18);
      if (local_138 == 0) {
        uVar5 = ggml_backend_name(local_18);
        printf("failed to allocate tensors [%s] ",uVar5);
        ggml_free(local_48);
        local_1 = false;
      }
      else {
        ggml_build_forward_expand(in_RDI[1],local_68);
        local_140 = in_RDI + 4;
        local_148._M_current =
             (ggml_tensor **)
             std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin(this_00);
        local_150 = (ggml_tensor **)
                    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                                   *)__lhs,(__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                                            *)this_00), bVar1) {
          ppgVar8 = __gnu_cxx::
                    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                    ::operator*(&local_148);
          local_158 = *ppgVar8;
          ggml_graph_add_node(in_RDI[1],local_158);
          __gnu_cxx::
          __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
          ::operator++(&local_148);
        }
        (**(code **)(*in_RDI + 0x58))(in_RDI,local_48);
        local_178[0] = 1;
        local_170 = (**(code **)(*in_RDI + 0x28))();
        local_168 = local_18;
        local_160 = local_20;
        lVar3 = in_RDI[1];
        p_Var9 = eval(ggml_backend*,ggml_backend*,char_const*)::
                 {lambda(int,ggml_tensor*,ggml_tensor*,void*)#1}::operator_cast_to_function_pointer
                           (&local_179);
        bVar2 = ggml_backend_compare_graph_backend(local_18,local_20,lVar3,p_Var9,local_178);
        if ((bVar2 & 1) == 0) {
          printf("compare failed ");
        }
        ggml_backend_buffer_free(local_138);
        ggml_free(local_48);
        if (((local_178[0] & 1) == 0) || ((bVar2 & 1) == 0)) {
          printf("\x1b[1;31mFAIL\x1b[0m\n");
          local_1 = false;
        }
        else {
          printf("\x1b[1;32mOK\x1b[0m\n");
          local_1 = true;
        }
      }
    }
  }
  else {
    ggml_free(local_48);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool eval(ggml_backend_t backend1, ggml_backend_t backend2, const char * op_name) {
        mode = MODE_TEST;

        ggml_init_params params = {
            /* .mem_size = */ ggml_tensor_overhead()*128 + ggml_graph_overhead(),
            /* .mem_base = */ NULL,
            /* .no_alloc = */ true,
        };
        ggml_context * ctx = ggml_init(params);
        GGML_ASSERT(ctx);

        gf = ggml_new_graph(ctx);

        // pre-graph sentinel
        add_sentinel(ctx);

        ggml_tensor * out = build_graph(ctx);

        if (op_name != nullptr && op_desc(out) != op_name) {
            //printf("  %s: skipping\n", op_desc(out).c_str());
            ggml_free(ctx);
            return true;
        }

        printf("  %s(%s): ", op_desc(out).c_str(), vars().c_str());
        fflush(stdout);

        // check if the backends support the ops
        bool supported = true;
        for (ggml_backend_t backend : {backend1, backend2}) {
            for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
                if (!ggml_backend_supports_op(backend, t)) {
                    printf("not supported [%s] ", ggml_backend_name(backend));
                    supported = false;
                    break;
                }
            }
        }
        if (!supported) {
            printf("\n");
            ggml_free(ctx);
            return true;
        }

        // post-graph sentinel
        add_sentinel(ctx);

        // allocate
        ggml_backend_buffer_t buf = ggml_backend_alloc_ctx_tensors(ctx, backend1);

        if (buf == NULL) {
            printf("failed to allocate tensors [%s] ", ggml_backend_name(backend1));
            ggml_free(ctx);
            return false;
        }

        // build graph
        ggml_build_forward_expand(gf, out);

        // add sentinels as graph nodes so that they are checked in the callback
        for (ggml_tensor * sentinel : sentinels) {
            ggml_graph_add_node(gf, sentinel);
        }

        // randomize tensors
        initialize_tensors(ctx);

        // compare
        struct callback_userdata {
            bool   ok;
            double max_err;
            ggml_backend_t backend1;
            ggml_backend_t backend2;
        };

        callback_userdata ud {
            true,
            max_nmse_err(),
            backend1,
            backend2
        };

        auto callback = [](int index, ggml_tensor * t1, ggml_tensor * t2, void * user_data) -> bool {
            callback_userdata * ud = (callback_userdata *) user_data;
            const char * bn1 = ggml_backend_name(ud->backend1);
            const char * bn2 = ggml_backend_name(ud->backend2);

            if (t1->op == GGML_OP_NONE) {
                // sentinels must be unchanged
                std::vector<uint8_t> t1_data(ggml_nbytes(t1));
                std::vector<uint8_t> t2_data(ggml_nbytes(t2));
                ggml_backend_tensor_get(t1, t1_data.data(), 0, ggml_nbytes(t1));
                ggml_backend_tensor_get(t2, t2_data.data(), 0, ggml_nbytes(t2));

                if (memcmp(t1_data.data(), t2_data.data(), ggml_nbytes(t1)) != 0) {
                    printf("sentinel mismatch: %s ", t1->name);
                    ud->ok = false;
                    return true;
                }
            }

            std::vector<float> f1 = tensor_to_float(t1);
            std::vector<float> f2 = tensor_to_float(t2);

            for (size_t i = 0; i < f1.size(); i++) {
                // check for nans
                if (std::isnan(f1[i]) || std::isnan(f2[i])) {
                    printf("[%s] NaN at index %zu (%s=%f %s=%f) ", ggml_op_desc(t1), i, bn1, f1[i], bn2, f2[i]);
                    ud->ok = false;
                    return true;
                }
                // check for infs: both must be inf of the same sign, or both must be finite
                if (isinf_or_max(f1[i]) || isinf_or_max(f2[i])) {
                    if (isinf_or_max(f1[i]) && isinf_or_max(f2[i])) {
                        if (std::signbit(f1[i]) != std::signbit(f2[i])) {
                            printf("[%s] inf sign mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                            ud->ok = false;
                            return true;
                        }
                    } else {
                        printf("[%s] inf mismatch: %s=%f %s=%f ", ggml_op_desc(t1), bn1, f1[i], bn2, f2[i]);
                        ud->ok = false;
                        return true;
                    }
                }
            }

            double err = nmse(f1.data(), f2.data(), f1.size());
            if (err > ud->max_err) {
                printf("[%s] NMSE = %.9f > %.9f ", ggml_op_desc(t1), err, ud->max_err);
                //for (int i = 0; i < (int) f1.size(); i++) {
                //    printf("%5d %9.6f %9.6f, diff = %9.6f\n", i, f1[i], f2[i], f1[i] - f2[i]);
                //}
                //printf("\n");
                //exit(1);
                ud->ok = false;
            }
            return true;

            GGML_UNUSED(index);
        };

        const bool cmp_ok = ggml_backend_compare_graph_backend(backend1, backend2, gf, callback, &ud);

        if (!cmp_ok) {
            printf("compare failed ");
        }

        ggml_backend_buffer_free(buf);

        ggml_free(ctx);

        if (ud.ok && cmp_ok) {
            printf("\033[1;32mOK\033[0m\n");
            return true;
        }

        printf("\033[1;31mFAIL\033[0m\n");
        return false;
    }